

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_rea.c
# Opt level: O3

size_t tool_read_cb(char *buffer,size_t sz,size_t nmemb,void *userdata)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  int *piVar6;
  long lVar7;
  undefined1 uVar8;
  timeval newer;
  timeval timeout;
  fd_set bits;
  timeval local_c8;
  fd_set local_b8;
  
  lVar1 = *(long *)((long)userdata + 0x10);
  if ((*(long *)((long)userdata + 0x1b0) != -1) &&
     (*(long *)((long)userdata + 0x1b8) == *(long *)((long)userdata + 0x1b0))) {
    return 0;
  }
  if (*(long *)(lVar1 + 0xb8) != 0) {
    newer = tvnow();
    lVar4 = tvdiff(newer,*(timeval *)((long)userdata + 0x48));
    lVar7 = *(long *)(lVar1 + 0xb8) - lVar4;
    if (*(long *)(lVar1 + 0xb8) < lVar4) {
      return 0;
    }
    local_c8.tv_sec = lVar7 / 1000;
    local_c8.tv_usec = (lVar7 % 1000) * 1000;
    local_b8.fds_bits[0] = 0;
    local_b8.fds_bits[1] = 0;
    local_b8.fds_bits[2] = 0;
    local_b8.fds_bits[3] = 0;
    local_b8.fds_bits[4] = 0;
    local_b8.fds_bits[5] = 0;
    local_b8.fds_bits[6] = 0;
    local_b8.fds_bits[7] = 0;
    local_b8.fds_bits[8] = 0;
    local_b8.fds_bits[9] = 0;
    local_b8.fds_bits[10] = 0;
    local_b8.fds_bits[0xb] = 0;
    local_b8.fds_bits[0xc] = 0;
    local_b8.fds_bits[0xd] = 0;
    local_b8.fds_bits[0xe] = 0;
    local_b8.fds_bits[0xf] = 0;
    iVar3 = *(int *)((long)userdata + 0x80);
    iVar2 = iVar3 + 0x3f;
    if (-1 < iVar3) {
      iVar2 = iVar3;
    }
    local_b8.fds_bits[iVar2 >> 6] =
         local_b8.fds_bits[iVar2 >> 6] | 1L << ((byte)(iVar3 % 0x40) & 0x3f);
    iVar3 = select(iVar3 + 1,&local_b8,(fd_set *)0x0,(fd_set *)0x0,&local_c8);
    if (iVar3 == 0) {
      return 0;
    }
  }
  sVar5 = read(*(int *)((long)userdata + 0x80),buffer,nmemb * sz);
  if ((long)sVar5 < 0) {
    piVar6 = __errno_location();
    if (*piVar6 == 0xb) {
      *piVar6 = 0;
      sVar5 = 0x10000001;
      uVar8 = 1;
      goto LAB_0010c195;
    }
    sVar5 = 0;
  }
  if ((*(long *)((long)userdata + 0x1b0) == -1) ||
     ((long)(*(long *)((long)userdata + 0x1b8) + sVar5) <= *(long *)((long)userdata + 0x1b0))) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    warnf(*(GlobalConfig **)(*(long *)((long)userdata + 0x10) + 0x528),
          "File size larger in the end than when started. Dropping at least %ld bytes");
    sVar5 = *(long *)((long)userdata + 0x1b0) - *(long *)((long)userdata + 0x1b8);
  }
LAB_0010c195:
  *(undefined1 *)(lVar1 + 0x342) = uVar8;
  return sVar5;
}

Assistant:

size_t tool_read_cb(char *buffer, size_t sz, size_t nmemb, void *userdata)
{
  ssize_t rc = 0;
  struct per_transfer *per = userdata;
  struct OperationConfig *config = per->config;

  if((per->uploadfilesize != -1) &&
     (per->uploadedsofar == per->uploadfilesize)) {
    /* done */
    return 0;
  }

  if(config->timeout_ms) {
    struct timeval now = tvnow();
    long msdelta = tvdiff(now, per->start);

    if(msdelta > config->timeout_ms)
      /* timeout */
      return 0;
#ifndef _WIN32
    /* this logic waits on read activity on a file descriptor that is not a
       socket which makes it not work with select() on Windows */
    else {
      fd_set bits;
      struct timeval timeout;
      long wait = config->timeout_ms - msdelta;

      /* wait this long at the most */
      timeout.tv_sec = wait/1000;
      timeout.tv_usec = (int)((wait%1000)*1000);

      FD_ZERO(&bits);
      FD_SET(per->infd, &bits);
      if(!select(per->infd + 1, &bits, NULL, NULL, &timeout))
        return 0; /* timeout */
    }
#endif
  }

  rc = read(per->infd, buffer, sz*nmemb);
  if(rc < 0) {
    if(errno == EAGAIN) {
      errno = 0;
      config->readbusy = TRUE;
      return CURL_READFUNC_PAUSE;
    }
    /* since size_t is unsigned we cannot return negative values fine */
    rc = 0;
  }
  if((per->uploadfilesize != -1) &&
     (per->uploadedsofar + rc > per->uploadfilesize)) {
    /* do not allow uploading more than originally set out to do */
    curl_off_t delta = per->uploadedsofar + rc - per->uploadfilesize;
    warnf(per->config->global, "File size larger in the end than when "
          "started. Dropping at least %" CURL_FORMAT_CURL_OFF_T " bytes",
          delta);
    rc = (ssize_t)(per->uploadfilesize - per->uploadedsofar);
  }
  config->readbusy = FALSE;

  /* when select() returned zero here, it timed out */
  return (size_t)rc;
}